

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Am_Connection::Receive_Object(Am_Connection *this,Am_Object *the_obj)

{
  Am_Connection_Data *pAVar1;
  Am_Slot_Key key;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value;
  bool local_79;
  Am_Value local_70;
  Am_Value local_60;
  Am_Assoc local_50;
  Am_Assoc blessing;
  Am_Value_List slot_list;
  Incomplete_Object_Ptr local_28;
  Incomplete_Object_Ptr prev_ptr;
  Incomplete_Object_Ptr new_partial_obj_ptr;
  Am_Object *the_obj_local;
  Am_Connection *this_local;
  
  prev_ptr = this->data->Object_Queue;
  while( true ) {
    local_79 = false;
    if (prev_ptr != (Incomplete_Object_Ptr)0x0) {
      local_79 = Am_Object::operator!=(&prev_ptr->obj,the_obj);
    }
    if (local_79 == false) break;
    local_28 = prev_ptr;
    prev_ptr = prev_ptr->next;
  }
  if (prev_ptr == (Incomplete_Object_Ptr)0x0) {
    prev_ptr = (Incomplete_Object_Ptr)operator_new(0x38);
    incomplete_obj_node::incomplete_obj_node(prev_ptr);
  }
  else {
    local_28->next = prev_ptr->next;
  }
  Am_Object::operator=(&prev_ptr->obj,the_obj);
  pAVar3 = Am_Object::Get(the_obj,0xb8,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&blessing,pAVar3);
  Am_Value::Am_Value(&local_60,this);
  uVar2 = Am_Value_List::Length((Am_Value_List *)&blessing);
  Am_Value::Am_Value(&local_70,(uint)uVar2);
  Am_Assoc::Am_Assoc(&local_50,&local_60,&local_70);
  Am_Value::~Am_Value(&local_70);
  Am_Value::~Am_Value(&local_60);
  key = Am_NET_BLESSING;
  value = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_50);
  Am_Object::Set(&prev_ptr->obj,key,value,0);
  prev_ptr->bogus = true;
  pAVar3 = Am_Object::Get(the_obj,0xb8,0);
  Am_Value_List::operator=(&prev_ptr->slot_list,pAVar3);
  pAVar1 = this->data;
  (prev_ptr->prev_receiver).from_wrapper = (pAVar1->my_receiver).from_wrapper;
  (prev_ptr->prev_receiver).Call = (pAVar1->my_receiver).Call;
  pAVar1 = this->data;
  (pAVar1->my_receiver).from_wrapper = receive_obj.from_wrapper;
  (pAVar1->my_receiver).Call = receive_obj.Call;
  prev_ptr->next = this->data->Object_Queue;
  this->data->Object_Queue = prev_ptr;
  Am_Assoc::~Am_Assoc(&local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&blessing);
  return;
}

Assistant:

void
Am_Connection::Receive_Object(Am_Object &the_obj)
{
  //
  //This implements a "latest received" policy.
  //It enforces that there will only be one copy of an object being
  // built at a time.
  //
  Incomplete_Object_Ptr new_partial_obj_ptr, prev_ptr;
  new_partial_obj_ptr = data->Object_Queue;
  while ((new_partial_obj_ptr != nullptr) &&
         (new_partial_obj_ptr->obj != the_obj)) {
    prev_ptr = new_partial_obj_ptr;
    new_partial_obj_ptr = new_partial_obj_ptr->next;
  }
  if (new_partial_obj_ptr == nullptr)
    new_partial_obj_ptr = new Incomplete_Object_Type;
  else
    //Move this object to the head of the list and restart
    //building it from scratch.
    prev_ptr->next = new_partial_obj_ptr->next;

  //Risk: If objects come in fast and the demons
  // do not fire soon after an object is received...
  // Might need to maintain multiple object states to ensure integrity
  // During simultaneous Send and Receives.
  new_partial_obj_ptr->obj = the_obj;
  // Declaw demon during receive
  Am_Value_List slot_list = the_obj.Get(Am_SLOTS_TO_SAVE);
  Am_Assoc blessing((Am_Ptr)this, (slot_list.Length()));
  new_partial_obj_ptr->obj.Set(Am_NET_BLESSING, blessing);

  new_partial_obj_ptr->bogus = true;
  new_partial_obj_ptr->slot_list = the_obj.Get(Am_SLOTS_TO_SAVE);

  new_partial_obj_ptr->prev_receiver = data->my_receiver;
  data->my_receiver = receive_obj;

  new_partial_obj_ptr->next = data->Object_Queue;
  data->Object_Queue = new_partial_obj_ptr;
}